

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<char>_> *
kj::parse::Many_<kj::parse::CharGroup_,_false>::Impl<capnp::compiler::Lexer::ParserInput,_char>::
apply(Maybe<kj::Array<char>_> *__return_storage_ptr__,CharGroup_ *subParser,ParserInput *input)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  size_t newSize;
  ulong uVar4;
  Results results;
  Vector<char> local_58;
  Maybe<kj::Array<char>_> *local_38;
  
  local_58.builder.ptr = (char *)0x0;
  local_58.builder.pos = (RemoveConst<char> *)0x0;
  local_58.builder.endPtr = (char *)0x0;
  local_58.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_38 = __return_storage_ptr__;
  do {
    pbVar2 = (byte *)(input->super_IteratorInput<char,_const_char_*>).pos;
    if (pbVar2 == (byte *)(input->super_IteratorInput<char,_const_char_*>).end) break;
    bVar1 = *pbVar2;
    uVar4 = 1L << (bVar1 & 0x3f);
    pbVar3 = pbVar2 + ((uVar4 & subParser->bits[bVar1 >> 6]) != 0);
    uVar4 = uVar4 & subParser->bits[bVar1 >> 6];
    if (uVar4 == 0) {
      if (pbVar2 < pbVar3) {
        pbVar2 = pbVar3;
      }
      pbVar3 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
      if (pbVar2 <= pbVar3) {
        pbVar2 = pbVar3;
      }
      (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar2;
      break;
    }
    (input->super_IteratorInput<char,_const_char_*>).pos = (char *)pbVar3;
    if (local_58.builder.pos == local_58.builder.endPtr) {
      newSize = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
      if (local_58.builder.endPtr == local_58.builder.ptr) {
        newSize = 4;
      }
      Vector<char>::setCapacity(&local_58,newSize);
    }
    *local_58.builder.pos = bVar1;
    local_58.builder.pos = local_58.builder.pos + 1;
    if (pbVar3 <= pbVar2) {
      pbVar3 = pbVar2;
    }
    pbVar2 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
    if (pbVar3 <= pbVar2) {
      pbVar3 = pbVar2;
    }
    (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar3;
  } while (uVar4 != 0);
  if (local_58.builder.pos != local_58.builder.endPtr) {
    Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  (local_38->ptr).isSet = true;
  (local_38->ptr).field_1.value.ptr = local_58.builder.ptr;
  (local_38->ptr).field_1.value.size_ = (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (local_38->ptr).field_1.value.disposer = local_58.builder.disposer;
  return local_38;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }